

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O2

void test_2d_static<1ul,1ul,1ul,1ul>(void)

{
  bool bVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  value_type *pvStackY_60;
  int dptr [1];
  value_type true_idx;
  value_type *local_40;
  int *local_38;
  
  true_idx = CONCAT71(true_idx._1_7_,1);
  local_40 = (value_type *)CONCAT71(local_40._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb7,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",(bool *)&true_idx,
             (bool *)&local_40);
  true_idx = 1;
  local_40._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb9,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&true_idx,
             (int *)&local_40);
  true_idx = 1;
  local_40 = (value_type *)CONCAT44(local_40._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xba,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&true_idx,
             (int *)&local_40);
  true_idx = 1;
  local_40 = (value_type *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbc,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&true_idx,
             (unsigned_long *)&local_40);
  true_idx = 1;
  local_40 = (value_type *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbd,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&true_idx,
             (unsigned_long *)&local_40);
  true_idx = CONCAT71(true_idx._1_7_,1);
  local_40 = (value_type *)CONCAT71(local_40._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc3,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",(bool *)&true_idx,
             (bool *)&local_40);
  true_idx = 1;
  local_40 = (value_type *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc5,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&true_idx,
             (unsigned_long *)&local_40);
  true_idx = 1;
  local_40 = (value_type *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc6,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&true_idx,
             (unsigned_long *)&local_40);
  true_idx = 1;
  local_40 = (value_type *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,200,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&true_idx,
             (unsigned_long *)&local_40);
  true_idx = 1;
  local_40 = (value_type *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc9,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&true_idx,
             (unsigned_long *)&local_40);
  bVar1 = true;
  pvVar3 = (value_type *)dptr;
  pvVar2 = (value_type *)0x0;
  while (bVar1) {
    bVar1 = true;
    pvStackY_60 = (value_type *)0x0;
    while (bVar1) {
      true_idx = (value_type)pvStackY_60;
      local_40 = pvVar2;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd3,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",
                 (unsigned_long *)&local_40,&true_idx);
      local_38 = dptr + true_idx;
      local_40 = pvVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd5,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",
                 (int **)&local_40,&local_38);
      dptr[0] = 0x2a;
      local_40 = (value_type *)CONCAT44(local_40._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd9,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",(int *)pvVar3,
                 (int *)&local_40);
      bVar1 = false;
      pvStackY_60 = (value_type *)0x1;
    }
    bVar1 = false;
    pvVar3 = &true_idx;
    pvStackY_60 = (value_type *)0x1;
    pvVar2 = pvStackY_60;
  }
  pvVar3 = (value_type *)dptr;
  bVar1 = true;
  pvVar2 = (value_type *)0x0;
  while (bVar1) {
    bVar1 = true;
    pvStackY_60 = (value_type *)0x0;
    while (bVar1) {
      true_idx = (value_type)pvStackY_60;
      local_40 = pvVar2;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe3,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",
                 (unsigned_long *)&local_40,&true_idx);
      local_38 = dptr + true_idx;
      local_40 = pvVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe5,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",
                 (int **)&local_40,&local_38);
      dptr[0] = 0x11;
      local_40 = (value_type *)CONCAT44(local_40._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe9,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",(int *)pvVar3,
                 (int *)&local_40);
      bVar1 = false;
      pvStackY_60 = (value_type *)0x1;
    }
    bVar1 = false;
    pvVar3 = &true_idx;
    pvStackY_60 = (value_type *)0x1;
    pvVar2 = pvStackY_60;
  }
  pvVar3 = (value_type *)dptr;
  bVar1 = true;
  pvVar2 = (value_type *)0x0;
  while (bVar1) {
    bVar1 = true;
    pvStackY_60 = (value_type *)0x0;
    while (bVar1) {
      true_idx = (value_type)pvStackY_60;
      local_40 = pvVar2;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xf2,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",
                 (unsigned_long *)&local_40,&true_idx);
      local_40 = (value_type *)CONCAT44(local_40._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xf9,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",(int *)pvVar3,
                 (int *)&local_40);
      bVar1 = false;
      pvStackY_60 = (value_type *)0x1;
    }
    bVar1 = false;
    pvVar3 = &true_idx;
    pvStackY_60 = (value_type *)0x1;
    pvVar2 = pvStackY_60;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_right<
        dimensions<X / N, Y / M>, dimensions<N, M>, dimensions<0, 0> 
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    int dptr[X * Y];

    // Set all elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.stepping()[0]))
           && (0 == (j % sub_l.stepping()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}